

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O0

uint64_t masked_vbyte_read_group(uint8_t *in,uint32_t *out,uint64_t mask,uint64_t *ints_read)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  __m128i alVar4;
  __m128i alVar5;
  __m128i alVar6;
  __m128i *palVar7;
  undefined8 *in_RCX;
  uint in_EDX;
  undefined1 in_SIL;
  undefined1 in_register_00000031;
  undefined6 in_register_00000032;
  undefined1 in_DIL;
  undefined1 in_register_00000039;
  undefined6 in_register_0000003a;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i data_bits;
  __m128i result_2;
  __m128i low_middle;
  __m128i high_bytes_shifted_1;
  __m128i middle_bytes_shifted;
  __m128i high_bytes_1;
  __m128i middle_bytes;
  __m128i low_bytes_1;
  __m128i bytes_to_decode_2;
  __m128i unpacked_result_b;
  __m128i unpacked_result_a;
  __m128i packed_result;
  __m128i high_bytes_shifted;
  __m128i high_bytes;
  __m128i low_bytes;
  __m128i bytes_to_decode_1;
  __m128i shuffle_vector;
  uint8_t index;
  uint64_t consumed;
  index_bytes_consumed combined;
  uint32_t low_12_bits;
  __m128i result_1;
  __m128i *mout;
  __m128i initial;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  byte local_60e;
  byte bStack_60d;
  undefined8 local_608;
  undefined8 uStack_600;
  ulong local_5b8;
  uint uStack_78;
  __m128i result;
  __m128i result_evens;
  __m128i low_byte;
  __m128i recombined;
  __m128i shifted_split_bytes;
  __m128i split_bytes;
  __m128i bytes_to_decode;
  
  puVar3 = (undefined8 *)CONCAT62(in_register_00000032,CONCAT11(in_register_00000031,in_SIL));
  auVar9 = vlddqu_avx(*(undefined1 (*) [16])
                       CONCAT62(in_register_0000003a,CONCAT11(in_register_00000039,in_DIL)));
  if ((in_EDX & 0xffff) == 0) {
    low_byte[1]._0_4_ = auVar9._0_4_;
    auVar8 = vpmovsxbd_avx(ZEXT416((uint)low_byte[1]));
    local_608 = auVar8._0_8_;
    uStack_600 = auVar8._8_8_;
    *puVar3 = local_608;
    puVar3[1] = uStack_600;
    auVar8 = vpsrldq_avx(auVar9,4);
    result_evens[1]._0_4_ = auVar8._0_4_;
    auVar9 = vpmovsxbd_avx(ZEXT416((uint)result_evens[1]));
    local_608 = auVar9._0_8_;
    uStack_600 = auVar9._8_8_;
    puVar3[2] = local_608;
    puVar3[3] = uStack_600;
    auVar8 = vpsrldq_avx(auVar8,4);
    result[1]._0_4_ = auVar8._0_4_;
    auVar9 = vpmovsxbd_avx(ZEXT416((uint)result[1]));
    local_608 = auVar9._0_8_;
    uStack_600 = auVar9._8_8_;
    puVar3[4] = local_608;
    puVar3[5] = uStack_600;
    auVar9 = vpsrldq_avx(auVar8,4);
    uStack_78 = auVar9._0_4_;
    auVar9 = vpmovsxbd_avx(ZEXT416(uStack_78));
    local_608 = auVar9._0_8_;
    uStack_600 = auVar9._8_8_;
    puVar3[6] = local_608;
    puVar3[7] = uStack_600;
    *in_RCX = 0x10;
    local_5b8 = 0x10;
  }
  else {
    bStack_60d = combined_lookup[in_EDX & 0xfff].bytes_consumed;
    local_5b8 = (ulong)bStack_60d;
    local_60e = combined_lookup[in_EDX & 0xfff].index;
    palVar7 = vectors_sse3 + local_60e;
    alVar6 = *palVar7;
    alVar5 = *palVar7;
    alVar4 = *palVar7;
    if (local_60e < 0x40) {
      *in_RCX = 6;
      auVar1 = vpshufb_avx(auVar9,(undefined1  [16])alVar4);
      auVar9 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
      auVar9 = vpinsrw_avx(auVar9,0x7f,2);
      auVar9 = vpinsrw_avx(auVar9,0x7f,3);
      auVar9 = vpinsrw_avx(auVar9,0x7f,4);
      auVar9 = vpinsrw_avx(auVar9,0x7f,5);
      auVar9 = vpinsrw_avx(auVar9,0x7f,6);
      auVar9 = vpinsrw_avx(auVar9,0x7f,7);
      auVar9 = vpand_avx(auVar1,auVar9);
      auVar8 = vpinsrw_avx(ZEXT216(0x7f00),0x7f00,1);
      auVar8 = vpinsrw_avx(auVar8,0x7f00,2);
      auVar8 = vpinsrw_avx(auVar8,0x7f00,3);
      auVar8 = vpinsrw_avx(auVar8,0x7f00,4);
      auVar8 = vpinsrw_avx(auVar8,0x7f00,5);
      auVar8 = vpinsrw_avx(auVar8,0x7f00,6);
      auVar8 = vpinsrw_avx(auVar8,0x7f00,7);
      auVar8 = vpand_avx(auVar1,auVar8);
      auVar8 = vpsrlw_avx(auVar8,ZEXT416(1));
      auVar8 = vpor_avx(auVar9,auVar8);
      auVar9 = vpinsrd_avx(ZEXT416(0xffff),0xffff,1);
      auVar9 = vpinsrd_avx(auVar9,0xffff,2);
      auVar9 = vpinsrd_avx(auVar9,0xffff,3);
      auVar9 = vpand_avx(auVar8,auVar9);
      local_698 = auVar9._0_8_;
      uStack_690 = auVar9._8_8_;
      *puVar3 = local_698;
      puVar3[1] = uStack_690;
      auVar9 = vpsrld_avx(auVar8,ZEXT416(0x10));
      local_6a8 = auVar9._0_8_;
      uStack_6a0 = auVar9._8_8_;
      puVar3[2] = local_6a8;
      puVar3[3] = uStack_6a0;
    }
    else if (local_60e < 0x91) {
      *in_RCX = 4;
      auVar2 = vpshufb_avx(auVar9,(undefined1  [16])alVar5);
      auVar9 = vpinsrd_avx(ZEXT416(0x7f),0x7f,1);
      auVar9 = vpinsrd_avx(auVar9,0x7f,2);
      auVar9 = vpinsrd_avx(auVar9,0x7f,3);
      auVar9 = vpand_avx(auVar2,auVar9);
      auVar8 = vpinsrd_avx(ZEXT416(0x7f00),0x7f00,1);
      auVar8 = vpinsrd_avx(auVar8,0x7f00,2);
      auVar8 = vpinsrd_avx(auVar8,0x7f00,3);
      auVar8 = vpand_avx(auVar2,auVar8);
      auVar1 = vpinsrd_avx(ZEXT416(0x7f0000),0x7f0000,1);
      auVar1 = vpinsrd_avx(auVar1,0x7f0000,2);
      auVar1 = vpinsrd_avx(auVar1,0x7f0000,3);
      auVar1 = vpand_avx(auVar2,auVar1);
      auVar8 = vpsrld_avx(auVar8,ZEXT416(1));
      auVar1 = vpsrld_avx(auVar1,ZEXT416(2));
      auVar9 = vpor_avx(auVar9,auVar8);
      auVar9 = vpor_avx(auVar9,auVar1);
      local_728 = auVar9._0_8_;
      uStack_720 = auVar9._8_8_;
      *puVar3 = local_728;
      puVar3[1] = uStack_720;
    }
    else {
      *in_RCX = 2;
      auVar8 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
      auVar8 = vpinsrb_avx(auVar8,0x7f,2);
      auVar8 = vpinsrb_avx(auVar8,0x7f,3);
      auVar8 = vpinsrb_avx(auVar8,0x7f,4);
      auVar8 = vpinsrb_avx(auVar8,0x7f,5);
      auVar8 = vpinsrb_avx(auVar8,0x7f,6);
      auVar8 = vpinsrb_avx(auVar8,0x7f,7);
      auVar8 = vpinsrb_avx(auVar8,0x7f,8);
      auVar8 = vpinsrb_avx(auVar8,0x7f,9);
      auVar8 = vpinsrb_avx(auVar8,0x7f,10);
      auVar8 = vpinsrb_avx(auVar8,0x7f,0xb);
      auVar8 = vpinsrb_avx(auVar8,0x7f,0xc);
      auVar8 = vpinsrb_avx(auVar8,0x7f,0xd);
      auVar8 = vpinsrb_avx(auVar8,0x7f,0xe);
      auVar8 = vpinsrb_avx(auVar8,0x7f,0xf);
      auVar9 = vpand_avx(auVar9,auVar8);
      auVar8 = vpshufb_avx(auVar9,(undefined1  [16])alVar6);
      auVar9 = vpinsrw_avx(ZEXT216(0x80),0x40,1);
      auVar9 = vpinsrw_avx(auVar9,0x20,2);
      auVar9 = vpinsrw_avx(auVar9,0x10,3);
      auVar9 = vpinsrw_avx(auVar9,0x80,4);
      auVar9 = vpinsrw_avx(auVar9,0x40,5);
      auVar9 = vpinsrw_avx(auVar9,0x20,6);
      auVar9 = vpinsrw_avx(auVar9,0x10,7);
      auVar9 = vpmullw_avx(auVar8,auVar9);
      auVar1 = vpsllq_avx(auVar9,ZEXT416(8));
      auVar9 = vpor_avx(auVar9,auVar1);
      auVar8 = vpsrlq_avx(auVar8,ZEXT416(0x38));
      auVar8 = vpor_avx(auVar9,auVar8);
      auVar9 = vpinsrb_avx(ZEXT116(0),2,1);
      auVar9 = vpinsrb_avx(auVar9,4,2);
      auVar9 = vpinsrb_avx(auVar9,6,3);
      auVar9 = vpinsrb_avx(auVar9,8,4);
      auVar9 = vpinsrb_avx(auVar9,10,5);
      auVar9 = vpinsrb_avx(auVar9,0xc,6);
      auVar9 = vpinsrb_avx(auVar9,0xe,7);
      auVar9 = vpinsrb_avx(auVar9,0xff,8);
      auVar9 = vpinsrb_avx(auVar9,0xff,9);
      auVar9 = vpinsrb_avx(auVar9,0xff,10);
      auVar9 = vpinsrb_avx(auVar9,0xff,0xb);
      auVar9 = vpinsrb_avx(auVar9,0xff,0xc);
      auVar9 = vpinsrb_avx(auVar9,0xff,0xd);
      auVar9 = vpinsrb_avx(auVar9,0xff,0xe);
      auVar9 = vpinsrb_avx(auVar9,0xff,0xf);
      auVar9 = vpshufb_avx(auVar8,auVar9);
      local_7a8 = auVar9._0_8_;
      uStack_7a0 = auVar9._8_8_;
      *puVar3 = local_7a8;
      puVar3[1] = uStack_7a0;
    }
  }
  return local_5b8;
}

Assistant:

static uint64_t masked_vbyte_read_group(const uint8_t *in, uint32_t *out,
                                        uint64_t mask, uint64_t *ints_read) {
  __m128i initial = _mm_lddqu_si128((const __m128i *)(in));
  __m128i *mout = (__m128i *)out;

  if (!(mask & 0xFFFF)) {
    __m128i result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 0, result);
    initial = _mm_srli_si128(initial, 4);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 1, result);
    initial = _mm_srli_si128(initial, 4);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 2, result);
    initial = _mm_srli_si128(initial, 4);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 3, result);
    *ints_read = 16;
    return 16;
  }

  uint32_t low_12_bits = mask & 0xFFF;
  // combine index and bytes consumed into a single lookup
  index_bytes_consumed combined = combined_lookup[low_12_bits];
  uint64_t consumed = combined.bytes_consumed;
  uint8_t index = combined.index;

  // Slightly slower to use combined than to lookup individually?
  // uint64_t consumed = bytes_consumed[low_12_bits];
  // uint8_t index = vec_lookup[low_12_bits];

  __m128i shuffle_vector = vectors_sse3[index];
  //	__m128i shuffle_vector = {0, 0};  // speed check: 20% faster at large,
  //less at small

  if (index < 64) {
    *ints_read = 6;
    __m128i bytes_to_decode = _mm_shuffle_epi8(initial, shuffle_vector);
    __m128i low_bytes = _mm_and_si128(bytes_to_decode, _mm_set1_epi16(0x007F));
    __m128i high_bytes = _mm_and_si128(bytes_to_decode, _mm_set1_epi16(0x7F00));
    __m128i high_bytes_shifted = _mm_srli_epi16(high_bytes, 1);
    __m128i packed_result = _mm_or_si128(low_bytes, high_bytes_shifted);
    __m128i unpacked_result_a =
        _mm_and_si128(packed_result, _mm_set1_epi32(0x0000FFFF));
    _mm_storeu_si128(mout, unpacked_result_a);
    __m128i unpacked_result_b = _mm_srli_epi32(packed_result, 16);
    // _mm_storel_epi64(mout+1, unpacked_result_b);
    _mm_storeu_si128(mout + 1,
                     unpacked_result_b); // maybe faster to write 16 bytes?
    return consumed;
  }
  if (index < 145) {

    *ints_read = 4;

    __m128i bytes_to_decode = _mm_shuffle_epi8(initial, shuffle_vector);
    __m128i low_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x0000007F));
    __m128i middle_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x00007F00));
    __m128i high_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x007F0000));
    __m128i middle_bytes_shifted = _mm_srli_epi32(middle_bytes, 1);
    __m128i high_bytes_shifted = _mm_srli_epi32(high_bytes, 2);
    __m128i low_middle = _mm_or_si128(low_bytes, middle_bytes_shifted);
    __m128i result = _mm_or_si128(low_middle, high_bytes_shifted);
    _mm_storeu_si128(mout, result);
    return consumed;
  }

  *ints_read = 2;

  __m128i data_bits = _mm_and_si128(initial, _mm_set1_epi8(0x7F));
  __m128i bytes_to_decode = _mm_shuffle_epi8(data_bits, shuffle_vector);
  __m128i split_bytes = _mm_mullo_epi16(
      bytes_to_decode, _mm_setr_epi16(128, 64, 32, 16, 128, 64, 32, 16));
  __m128i shifted_split_bytes = _mm_slli_epi64(split_bytes, 8);
  __m128i recombined = _mm_or_si128(split_bytes, shifted_split_bytes);
  __m128i low_byte = _mm_srli_epi64(bytes_to_decode, 56);
  __m128i result_evens = _mm_or_si128(recombined, low_byte);
  __m128i result = _mm_shuffle_epi8(
      result_evens,
      _mm_setr_epi8(0, 2, 4, 6, 8, 10, 12, 14, -1, -1, -1, -1, -1, -1, -1, -1));

  // _mm_storel_epi64(mout, result);
  _mm_storeu_si128(mout, result); // maybe faster to write 16 bytes?

  return consumed;
}